

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Sector_ChangeSound
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  int iVar2;
  FSectorTagIterator itr;
  
  if (arg0 == 0) {
    iVar2 = 0;
  }
  else {
    itr.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
    iVar2 = 0;
    itr.searchtag = arg0;
    while( true ) {
      uVar1 = FSectorTagIterator::Next(&itr);
      if ((int)uVar1 < 0) break;
      sectors[uVar1].seqType = (short)arg1;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

FUNC(LS_Sector_ChangeSound)
// Sector_ChangeSound (tag, sound)
{
	int secNum;
	bool rtn;

	if (!arg0)
		return false;

	rtn = false;
	FSectorTagIterator itr(arg0);
	while ((secNum = itr.Next()) >= 0)
	{
		sectors[secNum].seqType = arg1;
		rtn = true;
	}
	return rtn;
}